

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

JObject * __thiscall
pstack::JObject::field<char[12],unsigned_int,char>(JObject *this,char (*k) [12],uint *v,char *c)

{
  ostream *os;
  JSON<pstack::Field<char[12],_unsigned_int>,_char> local_48;
  undefined1 local_38 [8];
  Field<char[12],_unsigned_int> field;
  char *c_local;
  uint *v_local;
  char (*k_local) [12];
  JObject *this_local;
  
  field.v = (uint *)c;
  Field<char[12],_unsigned_int>::Field((Field<char[12],_unsigned_int> *)local_38,k,v);
  os = std::operator<<(this->os,this->sep);
  local_48 = json<pstack::Field<char[12],unsigned_int>,char>
                       ((Field<char[12],_unsigned_int> *)local_38,(char *)field.v);
  pstack::operator<<(os,&local_48);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }